

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O2

int wait_for_event(int pi,uint event,double timeout)

{
  uint id;
  int iVar1;
  double dVar2;
  int triggered;
  int local_1c;
  double local_18;
  
  local_1c = 0;
  iVar1 = -0x7db;
  if ((((uint)pi < 0x20) && (gPiInUse[(uint)pi] != 0)) && (iVar1 = 0, 0.0 < timeout)) {
    local_18 = timeout;
    dVar2 = time_time();
    local_18 = dVar2 + local_18;
    id = event_callback_ex(pi,event,_ewfe,&local_1c);
    while (local_1c == 0) {
      dVar2 = time_time();
      if (local_18 <= dVar2) break;
      time_sleep(0.05);
    }
    event_callback_cancel(id);
    iVar1 = local_1c;
  }
  return iVar1;
}

Assistant:

int wait_for_event(int pi, unsigned event, double timeout)
{
   int triggered = 0;
   int id;
   double due;

   if ((pi < 0) || (pi >= MAX_PI) || !gPiInUse[pi])
      return pigif_unconnected_pi;

   if (timeout <= 0.0) return 0;

   due = time_time() + timeout;

   id = event_callback_ex(pi, event, _ewfe, &triggered);

   while (!triggered && (time_time() < due)) time_sleep(0.05);

   event_callback_cancel(id);

   return triggered;
}